

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O3

void address_space_stl_le_ppc64
               (uc_struct_conflict11 *uc,AddressSpace *as,hwaddr addr,uint32_t val,MemTxAttrs attrs,
               MemTxResult *result)

{
  MemTxResult MVar1;
  MemoryRegion *mr;
  uint32_t *puVar2;
  hwaddr l;
  hwaddr local_38;
  hwaddr local_30;
  
  local_30 = 4;
  mr = flatview_translate_ppc64(uc,as->current_map,addr,&local_38,&local_30,true,attrs);
  if (((local_30 < 4) || (mr->ram != true)) || (mr->readonly == true)) {
    MVar1 = memory_region_dispatch_write_ppc64(uc,mr,local_38,(ulong)val,MO_32,attrs);
  }
  else {
    puVar2 = (uint32_t *)
             qemu_map_ram_ptr_ppc64((uc_struct_conflict11 *)mr->uc,mr->ram_block,local_38);
    *puVar2 = val;
    MVar1 = 0;
  }
  if (result != (MemTxResult *)0x0) {
    *result = MVar1;
  }
  return;
}

Assistant:

void glue(address_space_stl_le, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, uint32_t val, MemTxAttrs attrs, MemTxResult *result)
{
    glue(address_space_stl_internal, SUFFIX)(uc, ARG1, addr, val, attrs,
                                             result, DEVICE_LITTLE_ENDIAN);
}